

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.cpp
# Opt level: O2

Interaction * __thiscall
phyr::Shape::sample(Interaction *__return_storage_ptr__,Shape *this,Interaction *ref,Point2f *u,
                   double *pdf)

{
  double dVar1;
  double dVar2;
  Vector3<double> local_68;
  Vector3<double> local_48;
  
  (*this->_vptr_Shape[7])(__return_storage_ptr__,this,u,pdf);
  local_68.z = (__return_storage_ptr__->p).z - (ref->p).z;
  local_68.x = (__return_storage_ptr__->p).x - (ref->p).x;
  local_68.y = (__return_storage_ptr__->p).y - (ref->p).y;
  dVar2 = local_68.z * local_68.z + local_68.x * local_68.x + local_68.y * local_68.y;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    normalize<double>(&local_48,&local_68);
    local_68.z = local_48.z;
    local_68.x = local_48.x;
    local_68.y = local_48.y;
    dVar2 = distanceSquared<double>(&ref->p,&__return_storage_ptr__->p);
    local_48.z = -local_68.z;
    local_48.x = -local_68.x;
    local_48.y = -local_68.y;
    dVar1 = absDot<double>(&__return_storage_ptr__->n,&local_48);
    dVar2 = (dVar2 / dVar1) * *pdf;
    *pdf = dVar2;
    if (ABS(dVar2) != INFINITY) {
      return __return_storage_ptr__;
    }
  }
  *pdf = 0.0;
  return __return_storage_ptr__;
}

Assistant:

Interaction Shape::sample(const Interaction& ref, const Point2f& u,
                          Real* pdf) const {
    Interaction intr = sample(u, pdf);
    Vector3f wi = intr.p - ref.p;
    if (wi.lengthSquared() == 0)
        *pdf = 0;
    else {
        wi = normalize(wi);
        // Convert from area measure, as returned by the Sample() call
        // above, to solid angle measure.
        *pdf *= distanceSquared(ref.p, intr.p) / absDot(intr.n, -wi);
        if (std::isinf(*pdf)) *pdf = 0.f;
    }
    return intr;
}